

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

void __thiscall
cmFindLibraryHelper::RegexFromLiteral(cmFindLibraryHelper *this,string *out,string *in)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_38;
  char ch;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *in_local;
  string *out_local;
  cmFindLibraryHelper *this_local;
  
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_38._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc8);
    if (!bVar2) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    cVar1 = *pcVar3;
    if (((((cVar1 == '[') || (cVar1 == ']')) || (cVar1 == '(')) ||
        ((((cVar1 == ')' || (cVar1 == '\\')) ||
          ((cVar1 == '.' || ((cVar1 == '*' || (cVar1 == '+')))))) || (cVar1 == '?')))) ||
       (((cVar1 == '-' || (cVar1 == '^')) || (cVar1 == '$')))) {
      std::__cxx11::string::operator+=((string *)out,"\\");
    }
    std::__cxx11::string::operator+=((string *)out,cVar1);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmFindLibraryHelper::RegexFromLiteral(std::string& out,
                                           std::string const& in)
{
  for (char ch : in) {
    if (ch == '[' || ch == ']' || ch == '(' || ch == ')' || ch == '\\' ||
        ch == '.' || ch == '*' || ch == '+' || ch == '?' || ch == '-' ||
        ch == '^' || ch == '$') {
      out += "\\";
    }
#if defined(_WIN32) || defined(__APPLE__)
    out += static_cast<char>(tolower(ch));
#else
    out += ch;
#endif
  }
}